

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XcpLightCfg.c
# Opt level: O0

_Bool XcpLightCfg_processUserCommand(XcpLightMessage_t *msg,XcpLightMessage_t *reply_msg)

{
  XcpLightMessage_t *reply_msg_local;
  XcpLightMessage_t *msg_local;
  
  if (msg != (XcpLightMessage_t *)0x0) {
    reply_msg->length = 1;
    reply_msg->payload[0] = '\x1a';
  }
  return msg != (XcpLightMessage_t *)0x0;
}

Assistant:

extern bool XcpLightCfg_processUserCommand(XcpLightMessage_t *msg, XcpLightMessage_t *reply_msg)
{
  if (msg == NULL)
  {
    return false;
  }
  // build response message and ...
  reply_msg->length   = 1u;
  reply_msg->payload[0] = 0x1Au;
  return true; // ... send msg
}